

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O2

Error asmjit::v1_14::x86::FormatterInternal::formatRegister
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,RegType type,
                uint32_t id)

{
  ulong uVar1;
  Error EVar2;
  VirtReg *pVVar3;
  VirtReg *str;
  uint uVar4;
  bool bVar5;
  
  uVar4 = id - 0x100;
  if (((emitter == (BaseEmitter *)0x0 || 0xfffffefe < uVar4) || (emitter->_emitterType != kCompiler)
      ) || (*(uint *)&emitter[3]._errorHandler <= uVar4)) {
    uVar1 = (ulong)type;
    if (type < 0x20) {
      if (id < (byte)x86RegFormatInfo[uVar1 * 4 + 0x83]) {
        EVar2 = String::_opString(sb,kAppend,
                                  x86RegFormatInfo +
                                  (ulong)(byte)x86RegFormatInfo[uVar1 * 4 + 0x82] + (ulong)id * 4 +
                                  0x100,0xffffffffffffffff);
        return EVar2;
      }
      if (id < (byte)x86RegFormatInfo[uVar1 * 4 + 0x80]) {
        EVar2 = String::_opFormat(sb,kAppend,
                                  x86RegFormatInfo +
                                  (ulong)(byte)x86RegFormatInfo[uVar1 * 4 + 0x81] + 0x100,(ulong)id)
        ;
        return EVar2;
      }
      if ((ulong)(byte)x86RegFormatInfo[uVar1] != 0) {
        EVar2 = String::_opFormat(sb,kAppend,"%s@%u",(ulong)(byte)x86RegFormatInfo[uVar1] + 0x152aa4
                                  ,(ulong)id);
        return EVar2;
      }
    }
    EVar2 = String::_opFormat(sb,kAppend,"<Reg-%u>?%u",uVar1,(ulong)id);
    return EVar2;
  }
  pVVar3 = BaseCompiler::virtRegById((BaseCompiler *)emitter,id);
  if (pVVar3 == (VirtReg *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86formatter.cpp"
               ,0x183,"vReg != nullptr");
  }
  if (*(uint *)(pVVar3 + 0x18) < 0xc) {
    str = pVVar3 + 0x1c;
  }
  else {
    str = *(VirtReg **)(pVVar3 + 0x20);
  }
  if ((str == (VirtReg *)0x0) || (*str == (VirtReg)0x0)) {
    EVar2 = String::_opFormat(sb,kAppend,"%%%u",(ulong)uVar4);
  }
  else {
    EVar2 = String::_opString(sb,kAppend,(char *)str,0xffffffffffffffff);
  }
  if (EVar2 == 0) {
    bVar5 = true;
    if ((formatFlags & kRegType) == kNone) {
      if ((formatFlags & kRegCasts) == kNone) {
        return 0;
      }
      bVar5 = (byte)*pVVar3 >> 3 != type;
    }
    if (((type < 0x20) && (bVar5)) &&
       (((ulong)(byte)x86RegFormatInfo[type] != 0 &&
        (EVar2 = String::_opFormat(sb,kAppend,"@%s",(ulong)(byte)x86RegFormatInfo[type] + 0x152aa4),
        EVar2 != 0)))) {
      return EVar2;
    }
    return 0;
  }
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegister(String& sb, FormatFlags formatFlags, const BaseEmitter* emitter, Arch arch, RegType type, uint32_t id) noexcept {
  DebugUtils::unused(arch);
  const RegFormatInfo& info = x86RegFormatInfo;

#ifndef ASMJIT_NO_COMPILER
  if (Operand::isVirtId(id)) {
    if (emitter && emitter->emitterType() == EmitterType::kCompiler) {
      const BaseCompiler* cc = static_cast<const BaseCompiler*>(emitter);
      if (cc->isVirtIdValid(id)) {
        VirtReg* vReg = cc->virtRegById(id);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->name();
        if (name && name[0] != '\0')
          ASMJIT_PROPAGATE(sb.append(name));
        else
          ASMJIT_PROPAGATE(sb.appendFormat("%%%u", unsigned(Operand::virtIdToIndex(id))));

        bool formatType = (Support::test(formatFlags, FormatFlags::kRegType)) ||
                          (Support::test(formatFlags, FormatFlags::kRegCasts) && vReg->type() != type);

        if (formatType && uint32_t(type) <= uint32_t(RegType::kMaxValue)) {
          const RegFormatInfo::TypeEntry& typeEntry = info.typeEntries[size_t(type)];
          if (typeEntry.index)
            ASMJIT_PROPAGATE(sb.appendFormat("@%s", info.typeStrings + typeEntry.index));
        }

        return kErrorOk;
      }
    }
  }
#else
  DebugUtils::unused(emitter, formatFlags);
#endif

  if (uint32_t(type) <= uint32_t(RegType::kMaxValue)) {
    const RegFormatInfo::NameEntry& nameEntry = info.nameEntries[size_t(type)];

    if (id < nameEntry.specialCount)
      return sb.append(info.nameStrings + nameEntry.specialIndex + id * 4);

    if (id < nameEntry.count)
      return sb.appendFormat(info.nameStrings + nameEntry.formatIndex, unsigned(id));

    const RegFormatInfo::TypeEntry& typeEntry = info.typeEntries[size_t(type)];
    if (typeEntry.index)
      return sb.appendFormat("%s@%u", info.typeStrings + typeEntry.index, id);
  }

  return sb.appendFormat("<Reg-%u>?%u", uint32_t(type), id);
}